

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

double __thiscall despot::TagManhattanUpperBound::Value(TagManhattanUpperBound *this,Belief *belief)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  plVar2 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  lVar3 = plVar2[1] - *plVar2;
  if (lVar3 == 0) {
    dVar5 = 0.0;
  }
  else {
    lVar3 = lVar3 >> 3;
    dVar5 = 0.0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(*plVar2 + lVar4 * 8);
      dVar5 = dVar5 + *(double *)(lVar1 + 0x18) *
                      (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[*(int *)(lVar1 + 0xc)];
      lVar4 = lVar4 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar4);
  }
  return dVar5;
}

Assistant:

double Value(const Belief* belief) const {
		const vector<State*>& particles =
			static_cast<const ParticleBelief*>(belief)->particles();

		double value = 0;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			const TagState* state = static_cast<const TagState*>(particle);
			value += state->weight * value_[state->state_id];
		}
		return value;
	}